

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

void on_underlying_io_close_complete(void *context)

{
  int iVar1;
  TLS_IO_INSTANCE *tls_io_instance;
  void *context_local;
  
  iVar1 = *(int *)((long)context + 0x68);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      *(undefined4 *)((long)context + 0x68) = 0;
      indicate_open_complete((TLS_IO_INSTANCE *)context,IO_OPEN_ERROR);
    }
    else if (((2 < iVar1 - 2U) && (iVar1 == 5)) &&
            (*(undefined4 *)((long)context + 0x68) = 0, *(long *)((long)context + 0x18) != 0)) {
      (**(code **)((long)context + 0x18))(*(undefined8 *)((long)context + 0x38));
    }
  }
  close_openssl_instance((TLS_IO_INSTANCE *)context);
  return;
}

Assistant:

static void on_underlying_io_close_complete(void* context)
{
    SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)context;

    switch (sasl_client_io_instance->io_state)
    {
    default:
        break;

    case IO_STATE_OPENING_UNDERLYING_IO:
    case IO_STATE_SASL_HANDSHAKE:
        sasl_client_io_instance->io_state = IO_STATE_NOT_OPEN;
        indicate_open_complete(sasl_client_io_instance, IO_OPEN_ERROR);
        break;

    case IO_STATE_CLOSING:
        sasl_client_io_instance->io_state = IO_STATE_NOT_OPEN;
        indicate_close_complete(sasl_client_io_instance);
        break;
    }
}